

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O2

REF_STATUS ref_mpi_allsum(REF_MPI ref_mpi,void *value,REF_INT n,REF_TYPE type)

{
  uint uVar1;
  void *input;
  ulong uVar2;
  undefined8 uVar3;
  REF_MPI ref_mpi_00;
  char *pcVar4;
  
  if (type == 3) {
    if (n < 0) {
      pcVar4 = "malloc temp of REF_DBL negative";
      uVar3 = 0x355;
LAB_00203793:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar3,
             "ref_mpi_allsum",pcVar4);
      return 1;
    }
    ref_mpi_00 = (REF_MPI)((ulong)(uint)n * 8);
    input = malloc((size_t)ref_mpi_00);
    if (input == (void *)0x0) {
      pcVar4 = "malloc temp of REF_DBL NULL";
      uVar3 = 0x355;
LAB_00203805:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar3,
             "ref_mpi_allsum",pcVar4);
      return 2;
    }
    for (uVar2 = 0; (uint)n != uVar2; uVar2 = uVar2 + 1) {
      *(undefined8 *)((long)input + uVar2 * 8) = *(undefined8 *)((long)value + uVar2 * 8);
    }
  }
  else if (type == 2) {
    if (n < 0) {
      pcVar4 = "malloc temp of REF_LONG negative";
      uVar3 = 0x351;
      goto LAB_00203793;
    }
    ref_mpi_00 = (REF_MPI)((ulong)(uint)n * 8);
    input = malloc((size_t)ref_mpi_00);
    if (input == (void *)0x0) {
      pcVar4 = "malloc temp of REF_LONG NULL";
      uVar3 = 0x351;
      goto LAB_00203805;
    }
    for (uVar2 = 0; (uint)n != uVar2; uVar2 = uVar2 + 1) {
      *(undefined8 *)((long)input + uVar2 * 8) = *(undefined8 *)((long)value + uVar2 * 8);
    }
  }
  else {
    if (type != 1) {
      pcVar4 = "data type";
      uVar1 = 6;
      uVar3 = 0x359;
      goto LAB_0020370e;
    }
    if (n < 0) {
      pcVar4 = "malloc temp of REF_INT negative";
      uVar3 = 0x34d;
      goto LAB_00203793;
    }
    ref_mpi_00 = (REF_MPI)((ulong)(uint)n * 4);
    input = malloc((size_t)ref_mpi_00);
    if (input == (void *)0x0) {
      pcVar4 = "malloc temp of REF_INT NULL";
      uVar3 = 0x34d;
      goto LAB_00203805;
    }
    for (uVar2 = 0; (uint)n != uVar2; uVar2 = uVar2 + 1) {
      *(undefined4 *)((long)input + uVar2 * 4) = *(undefined4 *)((long)value + uVar2 * 4);
    }
  }
  uVar1 = ref_mpi_sum(ref_mpi_00,input,value,n,type);
  if (uVar1 == 0) {
    free(input);
    return 0;
  }
  pcVar4 = "sum";
  uVar3 = 0x35b;
LAB_0020370e:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar3,
         "ref_mpi_allsum",(ulong)uVar1,pcVar4);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_allsum(REF_MPI ref_mpi, void *value, REF_INT n,
                                  REF_TYPE type) {
  REF_INT i;
  void *temp = NULL;
  switch (type) {
    case REF_INT_TYPE:
      ref_malloc(temp, n, REF_INT);
      for (i = 0; i < n; i++) ((REF_INT *)temp)[i] = ((REF_INT *)value)[i];
      break;
    case REF_LONG_TYPE:
      ref_malloc(temp, n, REF_LONG);
      for (i = 0; i < n; i++) ((REF_LONG *)temp)[i] = ((REF_LONG *)value)[i];
      break;
    case REF_DBL_TYPE:
      ref_malloc(temp, n, REF_DBL);
      for (i = 0; i < n; i++) ((REF_DBL *)temp)[i] = ((REF_DBL *)value)[i];
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }
  RSS(ref_mpi_sum(ref_mpi, temp, value, n, type), "sum");
  ref_free(temp);
  RSS(ref_mpi_bcast(ref_mpi, value, n, type), "bcast")
  return REF_SUCCESS;
}